

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  undefined4 uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  RayHitK<4> *pRVar23;
  ulong uVar24;
  long lVar25;
  Scene *pSVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  Geometry *pGVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  float fVar88;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar126 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27c9;
  ulong local_27c8;
  ulong local_27c0;
  size_t local_27b8;
  RayHitK<4> *local_27b0;
  Scene *local_27a8;
  undefined1 local_27a0 [16];
  undefined1 local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 (*local_2740) [16];
  long local_2738;
  long local_2730;
  ulong local_2728;
  undefined1 *local_2720;
  void *local_2718;
  RTCRayQueryContext *local_2710;
  RayHitK<4> *local_2708;
  undefined1 (*local_2700) [16];
  undefined4 local_26f8;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [16];
  undefined1 *local_26b0;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [2] [16];
  undefined1 local_2620 [32];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  pauVar33 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar19;
  local_23c0._0_4_ = uVar19;
  local_23c0._8_4_ = uVar19;
  local_23c0._12_4_ = uVar19;
  local_23c0._16_4_ = uVar19;
  local_23c0._20_4_ = uVar19;
  local_23c0._24_4_ = uVar19;
  local_23c0._28_4_ = uVar19;
  auVar80 = ZEXT3264(local_23c0);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar19;
  local_23e0._0_4_ = uVar19;
  local_23e0._8_4_ = uVar19;
  local_23e0._12_4_ = uVar19;
  local_23e0._16_4_ = uVar19;
  local_23e0._20_4_ = uVar19;
  local_23e0._24_4_ = uVar19;
  local_23e0._28_4_ = uVar19;
  auVar81 = ZEXT3264(local_23e0);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar19;
  local_2400._0_4_ = uVar19;
  local_2400._8_4_ = uVar19;
  local_2400._12_4_ = uVar19;
  local_2400._16_4_ = uVar19;
  local_2400._20_4_ = uVar19;
  local_2400._24_4_ = uVar19;
  local_2400._28_4_ = uVar19;
  auVar87 = ZEXT3264(local_2400);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar124 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar88 = fVar106 * 0.99999964;
  fVar96 = fVar115 * 0.99999964;
  fVar99 = fVar124 * 0.99999964;
  fVar106 = fVar106 * 1.0000004;
  fVar115 = fVar115 * 1.0000004;
  fVar124 = fVar124 * 1.0000004;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2728 = uVar31 ^ 0x20;
  uVar34 = uVar29 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_2620._4_4_ = iVar2;
  local_2620._0_4_ = iVar2;
  local_2620._8_4_ = iVar2;
  local_2620._12_4_ = iVar2;
  local_2620._16_4_ = iVar2;
  local_2620._20_4_ = iVar2;
  local_2620._24_4_ = iVar2;
  local_2620._28_4_ = iVar2;
  auVar74 = ZEXT3264(local_2620);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar42 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_2740 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_2420 = fVar88;
  fStack_241c = fVar88;
  fStack_2418 = fVar88;
  fStack_2414 = fVar88;
  fStack_2410 = fVar88;
  fStack_240c = fVar88;
  fStack_2408 = fVar88;
  fStack_2404 = fVar88;
  local_2440 = fVar96;
  fStack_243c = fVar96;
  fStack_2438 = fVar96;
  fStack_2434 = fVar96;
  fStack_2430 = fVar96;
  fStack_242c = fVar96;
  fStack_2428 = fVar96;
  fStack_2424 = fVar96;
  local_2460 = fVar99;
  fStack_245c = fVar99;
  fStack_2458 = fVar99;
  fStack_2454 = fVar99;
  fStack_2450 = fVar99;
  fStack_244c = fVar99;
  fStack_2448 = fVar99;
  fStack_2444 = fVar99;
  local_2480 = fVar106;
  fStack_247c = fVar106;
  fStack_2478 = fVar106;
  fStack_2474 = fVar106;
  fStack_2470 = fVar106;
  fStack_246c = fVar106;
  fStack_2468 = fVar106;
  fStack_2464 = fVar106;
  local_24a0 = fVar115;
  fStack_249c = fVar115;
  fStack_2498 = fVar115;
  fStack_2494 = fVar115;
  fStack_2490 = fVar115;
  fStack_248c = fVar115;
  fStack_2488 = fVar115;
  fStack_2484 = fVar115;
  local_24c0 = fVar124;
  fStack_24bc = fVar124;
  fStack_24b8 = fVar124;
  fStack_24b4 = fVar124;
  fStack_24b0 = fVar124;
  fStack_24ac = fVar124;
  fStack_24a8 = fVar124;
  fStack_24a4 = fVar124;
  fVar90 = fVar88;
  fVar91 = fVar88;
  fVar92 = fVar88;
  fVar93 = fVar88;
  fVar94 = fVar88;
  fVar95 = fVar88;
  fVar97 = fVar96;
  fVar125 = fVar96;
  fVar128 = fVar96;
  fVar130 = fVar96;
  fVar132 = fVar96;
  fVar98 = fVar96;
  fVar100 = fVar99;
  fVar101 = fVar99;
  fVar102 = fVar99;
  fVar103 = fVar99;
  fVar104 = fVar99;
  fVar105 = fVar99;
  fVar109 = fVar106;
  fVar110 = fVar106;
  fVar111 = fVar106;
  fVar112 = fVar106;
  fVar113 = fVar106;
  fVar114 = fVar106;
  fVar118 = fVar115;
  fVar119 = fVar115;
  fVar120 = fVar115;
  fVar121 = fVar115;
  fVar122 = fVar115;
  fVar123 = fVar115;
  fVar127 = fVar124;
  fVar129 = fVar124;
  fVar131 = fVar124;
  fVar133 = fVar124;
  fVar134 = fVar124;
  fVar135 = fVar124;
  local_27c8 = uVar29;
  local_27c0 = uVar31;
  local_27b8 = k;
  local_27b0 = ray;
LAB_0165e811:
  do {
    do {
      if (pauVar33 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar22 = pauVar33 + -1;
      pauVar33 = pauVar33 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar22 + 8));
    uVar24 = *(ulong *)*pauVar33;
    while ((uVar24 & 8) == 0) {
      auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar31),auVar80._0_32_);
      auVar12._4_4_ = fVar90 * auVar11._4_4_;
      auVar12._0_4_ = fVar88 * auVar11._0_4_;
      auVar12._8_4_ = fVar91 * auVar11._8_4_;
      auVar12._12_4_ = fVar92 * auVar11._12_4_;
      auVar12._16_4_ = fVar93 * auVar11._16_4_;
      auVar12._20_4_ = fVar94 * auVar11._20_4_;
      auVar12._24_4_ = fVar95 * auVar11._24_4_;
      auVar12._28_4_ = auVar11._28_4_;
      auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar29),auVar81._0_32_);
      auVar13._4_4_ = fVar97 * auVar11._4_4_;
      auVar13._0_4_ = fVar96 * auVar11._0_4_;
      auVar13._8_4_ = fVar125 * auVar11._8_4_;
      auVar13._12_4_ = fVar128 * auVar11._12_4_;
      auVar13._16_4_ = fVar130 * auVar11._16_4_;
      auVar13._20_4_ = fVar132 * auVar11._20_4_;
      auVar13._24_4_ = fVar98 * auVar11._24_4_;
      auVar13._28_4_ = auVar11._28_4_;
      auVar11 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar32),auVar87._0_32_);
      auVar14._4_4_ = fVar100 * auVar12._4_4_;
      auVar14._0_4_ = fVar99 * auVar12._0_4_;
      auVar14._8_4_ = fVar101 * auVar12._8_4_;
      auVar14._12_4_ = fVar102 * auVar12._12_4_;
      auVar14._16_4_ = fVar103 * auVar12._16_4_;
      auVar14._20_4_ = fVar104 * auVar12._20_4_;
      auVar14._24_4_ = fVar105 * auVar12._24_4_;
      auVar14._28_4_ = auVar12._28_4_;
      auVar12 = vmaxps_avx(auVar14,auVar74._0_32_);
      local_26e0 = vmaxps_avx(auVar11,auVar12);
      auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + local_2728),auVar80._0_32_);
      auVar15._4_4_ = fVar109 * auVar11._4_4_;
      auVar15._0_4_ = fVar106 * auVar11._0_4_;
      auVar15._8_4_ = fVar110 * auVar11._8_4_;
      auVar15._12_4_ = fVar111 * auVar11._12_4_;
      auVar15._16_4_ = fVar112 * auVar11._16_4_;
      auVar15._20_4_ = fVar113 * auVar11._20_4_;
      auVar15._24_4_ = fVar114 * auVar11._24_4_;
      auVar15._28_4_ = auVar11._28_4_;
      auVar11 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + uVar34),auVar81._0_32_);
      auVar16._4_4_ = fVar118 * auVar11._4_4_;
      auVar16._0_4_ = fVar115 * auVar11._0_4_;
      auVar16._8_4_ = fVar119 * auVar11._8_4_;
      auVar16._12_4_ = fVar120 * auVar11._12_4_;
      auVar16._16_4_ = fVar121 * auVar11._16_4_;
      auVar16._20_4_ = fVar122 * auVar11._20_4_;
      auVar16._24_4_ = fVar123 * auVar11._24_4_;
      auVar16._28_4_ = auVar11._28_4_;
      auVar11 = vminps_avx(auVar15,auVar16);
      auVar12 = vsubps_avx(*(undefined1 (*) [32])(uVar24 + 0x40 + (uVar32 ^ 0x20)),auVar87._0_32_);
      auVar17._4_4_ = fVar127 * auVar12._4_4_;
      auVar17._0_4_ = fVar124 * auVar12._0_4_;
      auVar17._8_4_ = fVar129 * auVar12._8_4_;
      auVar17._12_4_ = fVar131 * auVar12._12_4_;
      auVar17._16_4_ = fVar133 * auVar12._16_4_;
      auVar17._20_4_ = fVar134 * auVar12._20_4_;
      auVar17._24_4_ = fVar135 * auVar12._24_4_;
      auVar17._28_4_ = auVar12._28_4_;
      auVar12 = vminps_avx(auVar17,auVar42._0_32_);
      auVar11 = vminps_avx(auVar11,auVar12);
      auVar11 = vcmpps_avx(local_26e0,auVar11,2);
      uVar18 = vmovmskps_avx(auVar11);
      if (uVar18 == 0) goto LAB_0165e811;
      uVar18 = uVar18 & 0xff;
      uVar27 = uVar24 & 0xfffffffffffffff0;
      lVar25 = 0;
      for (uVar24 = (ulong)uVar18; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar24 = *(ulong *)(uVar27 + lVar25 * 8);
      uVar18 = uVar18 - 1 & uVar18;
      uVar20 = (ulong)uVar18;
      if (uVar18 != 0) {
        uVar4 = *(uint *)(local_26e0 + lVar25 * 4);
        lVar25 = 0;
        for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar18 = uVar18 - 1 & uVar18;
        uVar21 = (ulong)uVar18;
        uVar20 = *(ulong *)(uVar27 + lVar25 * 8);
        uVar5 = *(uint *)(local_26e0 + lVar25 * 4);
        uVar29 = local_27c8;
        if (uVar18 == 0) {
          if (uVar4 < uVar5) {
            *(ulong *)*pauVar33 = uVar20;
            *(uint *)(*pauVar33 + 8) = uVar5;
            pauVar33 = pauVar33 + 1;
          }
          else {
            *(ulong *)*pauVar33 = uVar24;
            *(uint *)(*pauVar33 + 8) = uVar4;
            uVar24 = uVar20;
            pauVar33 = pauVar33 + 1;
          }
        }
        else {
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar24;
          auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar4));
          auVar51._8_8_ = 0;
          auVar51._0_8_ = uVar20;
          auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar5));
          lVar25 = 0;
          for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar18 = uVar18 - 1 & uVar18;
          uVar24 = (ulong)uVar18;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
          auVar44 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_26e0 + lVar25 * 4)));
          auVar54 = vpcmpgtd_avx(auVar51,auVar43);
          if (uVar18 == 0) {
            auVar63 = vpshufd_avx(auVar54,0xaa);
            auVar54 = vblendvps_avx(auVar51,auVar43,auVar63);
            auVar43 = vblendvps_avx(auVar43,auVar51,auVar63);
            auVar51 = vpcmpgtd_avx(auVar44,auVar54);
            auVar63 = vpshufd_avx(auVar51,0xaa);
            auVar51 = vblendvps_avx(auVar44,auVar54,auVar63);
            auVar54 = vblendvps_avx(auVar54,auVar44,auVar63);
            auVar44 = vpcmpgtd_avx(auVar54,auVar43);
            auVar63 = vpshufd_avx(auVar44,0xaa);
            auVar44 = vblendvps_avx(auVar54,auVar43,auVar63);
            auVar43 = vblendvps_avx(auVar43,auVar54,auVar63);
            *pauVar33 = auVar43;
            pauVar33[1] = auVar44;
            uVar24 = auVar51._0_8_;
            pauVar33 = pauVar33 + 2;
          }
          else {
            lVar25 = 0;
            for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            uVar18 = uVar18 - 1 & uVar18;
            uVar24 = (ulong)uVar18;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
            auVar63 = vpunpcklqdq_avx(auVar63,ZEXT416(*(uint *)(local_26e0 + lVar25 * 4)));
            if (uVar18 == 0) {
              auVar46 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar51,auVar43,auVar46);
              auVar43 = vblendvps_avx(auVar43,auVar51,auVar46);
              auVar51 = vpcmpgtd_avx(auVar63,auVar44);
              auVar46 = vpshufd_avx(auVar51,0xaa);
              auVar51 = vblendvps_avx(auVar63,auVar44,auVar46);
              auVar44 = vblendvps_avx(auVar44,auVar63,auVar46);
              auVar63 = vpcmpgtd_avx(auVar44,auVar43);
              auVar46 = vpshufd_avx(auVar63,0xaa);
              auVar63 = vblendvps_avx(auVar44,auVar43,auVar46);
              auVar43 = vblendvps_avx(auVar43,auVar44,auVar46);
              auVar44 = vpcmpgtd_avx(auVar51,auVar54);
              auVar46 = vpshufd_avx(auVar44,0xaa);
              auVar44 = vblendvps_avx(auVar51,auVar54,auVar46);
              auVar51 = vblendvps_avx(auVar54,auVar51,auVar46);
              auVar54 = vpcmpgtd_avx(auVar63,auVar51);
              auVar46 = vpshufd_avx(auVar54,0xaa);
              auVar54 = vblendvps_avx(auVar63,auVar51,auVar46);
              auVar51 = vblendvps_avx(auVar51,auVar63,auVar46);
              *pauVar33 = auVar43;
              pauVar33[1] = auVar51;
              pauVar33[2] = auVar54;
              uVar24 = auVar44._0_8_;
              pauVar22 = pauVar33 + 3;
            }
            else {
              *pauVar33 = auVar43;
              pauVar33[1] = auVar51;
              pauVar33[2] = auVar44;
              pauVar22 = pauVar33 + 3;
              pauVar33[3] = auVar63;
              do {
                lVar25 = 0;
                for (uVar31 = uVar24; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
                {
                  lVar25 = lVar25 + 1;
                }
                auVar44._8_8_ = 0;
                auVar44._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
                auVar43 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_26e0 + lVar25 * 4)));
                pauVar22[1] = auVar43;
                pauVar22 = pauVar22 + 1;
                uVar24 = uVar24 - 1 & uVar24;
              } while (uVar24 != 0);
              lVar25 = 0;
              while (pauVar22 != pauVar33) {
                auVar43 = pauVar33[1];
                uVar18 = vextractps_avx(auVar43,2);
                for (lVar28 = 0x10;
                    (lVar25 != lVar28 && (*(uint *)(pauVar33[-1] + lVar28 + 8) < uVar18));
                    lVar28 = lVar28 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar33 + lVar28) =
                       *(undefined1 (*) [16])(pauVar33[-1] + lVar28);
                }
                *(undefined1 (*) [16])(*pauVar33 + lVar28) = auVar43;
                lVar25 = lVar25 + -0x10;
                pauVar33 = pauVar33 + 1;
              }
              uVar24 = *(ulong *)*pauVar22;
              k = local_27b8;
              ray = local_27b0;
              uVar31 = local_27c0;
            }
            auVar74 = ZEXT3264(local_2620);
            pauVar33 = pauVar22;
          }
        }
      }
    }
    local_2738 = (ulong)((uint)uVar24 & 0xf) - 8;
    uVar24 = uVar24 & 0xfffffffffffffff0;
    for (local_2730 = 0; local_2730 != local_2738; local_2730 = local_2730 + 1) {
      lVar25 = local_2730 * 0x50;
      pSVar26 = context->scene;
      ppfVar6 = (pSVar26->vertices).items;
      pfVar7 = ppfVar6[*(uint *)(uVar24 + 0x30 + lVar25)];
      pfVar8 = ppfVar6[*(uint *)(uVar24 + 0x34 + lVar25)];
      pfVar9 = ppfVar6[*(uint *)(uVar24 + 0x38 + lVar25)];
      pfVar10 = ppfVar6[*(uint *)(uVar24 + 0x3c + lVar25)];
      auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar24 + lVar25)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar24 + 8 + lVar25)));
      auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar24 + lVar25)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar24 + 8 + lVar25)));
      auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar24 + 4 + lVar25)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar24 + 0xc + lVar25)));
      auVar51 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar24 + 4 + lVar25)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar24 + 0xc + lVar25)));
      auVar46 = vunpcklps_avx(auVar43,auVar51);
      auVar57 = vunpcklps_avx(auVar54,auVar44);
      auVar43 = vunpckhps_avx(auVar54,auVar44);
      auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar24 + 0x10 + lVar25)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar24 + 0x18 + lVar25)));
      auVar51 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar24 + 0x10 + lVar25)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar24 + 0x18 + lVar25)));
      auVar63 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar24 + 0x14 + lVar25)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar24 + 0x1c + lVar25)));
      auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar24 + 0x14 + lVar25)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar24 + 0x1c + lVar25)));
      auVar37 = vunpcklps_avx(auVar51,auVar54);
      auVar35 = vunpcklps_avx(auVar44,auVar63);
      auVar51 = vunpckhps_avx(auVar44,auVar63);
      auVar63 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar24 + 0x20 + lVar25)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar24 + 0x28 + lVar25)));
      auVar54 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar24 + 0x20 + lVar25)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar24 + 0x28 + lVar25)));
      auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar24 + 0x24 + lVar25)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar24 + 0x2c + lVar25)));
      auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar24 + 0x24 + lVar25)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar24 + 0x2c + lVar25)));
      auVar45 = vunpcklps_avx(auVar54,auVar44);
      auVar44 = vunpcklps_avx(auVar63,auVar36);
      auVar63 = vunpckhps_avx(auVar63,auVar36);
      puVar1 = (undefined8 *)(uVar24 + 0x30 + lVar25);
      local_2560 = *puVar1;
      uStack_2558 = puVar1[1];
      puVar1 = (undefined8 *)(uVar24 + 0x40 + lVar25);
      local_26f0 = *puVar1;
      uStack_26e8 = puVar1[1];
      uVar19 = *(undefined4 *)(ray + k * 4);
      auVar89._4_4_ = uVar19;
      auVar89._0_4_ = uVar19;
      auVar89._8_4_ = uVar19;
      auVar89._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar107._4_4_ = uVar19;
      auVar107._0_4_ = uVar19;
      auVar107._8_4_ = uVar19;
      auVar107._12_4_ = uVar19;
      uVar19 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar116._4_4_ = uVar19;
      auVar116._0_4_ = uVar19;
      auVar116._8_4_ = uVar19;
      auVar116._12_4_ = uVar19;
      local_2760 = vsubps_avx(auVar57,auVar89);
      local_2570 = vsubps_avx(auVar43,auVar107);
      local_2580 = vsubps_avx(auVar46,auVar116);
      auVar43 = vsubps_avx(auVar35,auVar89);
      auVar51 = vsubps_avx(auVar51,auVar107);
      auVar54 = vsubps_avx(auVar37,auVar116);
      auVar44 = vsubps_avx(auVar44,auVar89);
      auVar63 = vsubps_avx(auVar63,auVar107);
      auVar46 = vsubps_avx(auVar45,auVar116);
      local_2590 = vsubps_avx(auVar44,local_2760);
      local_25b0 = vsubps_avx(auVar63,local_2570);
      local_25a0 = vsubps_avx(auVar46,local_2580);
      auVar35._0_4_ = auVar44._0_4_ + local_2760._0_4_;
      auVar35._4_4_ = auVar44._4_4_ + local_2760._4_4_;
      auVar35._8_4_ = auVar44._8_4_ + local_2760._8_4_;
      auVar35._12_4_ = auVar44._12_4_ + local_2760._12_4_;
      auVar55._0_4_ = auVar63._0_4_ + local_2570._0_4_;
      auVar55._4_4_ = auVar63._4_4_ + local_2570._4_4_;
      auVar55._8_4_ = auVar63._8_4_ + local_2570._8_4_;
      auVar55._12_4_ = auVar63._12_4_ + local_2570._12_4_;
      fVar115 = local_2580._0_4_;
      auVar57._0_4_ = auVar46._0_4_ + fVar115;
      fVar124 = local_2580._4_4_;
      auVar57._4_4_ = auVar46._4_4_ + fVar124;
      fVar88 = local_2580._8_4_;
      auVar57._8_4_ = auVar46._8_4_ + fVar88;
      fVar96 = local_2580._12_4_;
      auVar57._12_4_ = auVar46._12_4_ + fVar96;
      auVar108._0_4_ = local_25a0._0_4_ * auVar55._0_4_;
      auVar108._4_4_ = local_25a0._4_4_ * auVar55._4_4_;
      auVar108._8_4_ = local_25a0._8_4_ * auVar55._8_4_;
      auVar108._12_4_ = local_25a0._12_4_ * auVar55._12_4_;
      auVar37 = vfmsub231ps_fma(auVar108,local_25b0,auVar57);
      auVar58._0_4_ = local_2590._0_4_ * auVar57._0_4_;
      auVar58._4_4_ = local_2590._4_4_ * auVar57._4_4_;
      auVar58._8_4_ = local_2590._8_4_ * auVar57._8_4_;
      auVar58._12_4_ = local_2590._12_4_ * auVar57._12_4_;
      auVar57 = vfmsub231ps_fma(auVar58,local_25a0,auVar35);
      auVar36._0_4_ = local_25b0._0_4_ * auVar35._0_4_;
      auVar36._4_4_ = local_25b0._4_4_ * auVar35._4_4_;
      auVar36._8_4_ = local_25b0._8_4_ * auVar35._8_4_;
      auVar36._12_4_ = local_25b0._12_4_ * auVar35._12_4_;
      auVar35 = vfmsub231ps_fma(auVar36,local_2590,auVar55);
      fVar106 = *(float *)(ray + k * 4 + 0x60);
      auVar52._0_4_ = fVar106 * auVar35._0_4_;
      auVar52._4_4_ = fVar106 * auVar35._4_4_;
      auVar52._8_4_ = fVar106 * auVar35._8_4_;
      auVar52._12_4_ = fVar106 * auVar35._12_4_;
      uVar19 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar82._4_4_ = uVar19;
      auVar82._0_4_ = uVar19;
      auVar82._8_4_ = uVar19;
      auVar82._12_4_ = uVar19;
      auVar57 = vfmadd231ps_fma(auVar52,auVar82,auVar57);
      uVar19 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar117._4_4_ = uVar19;
      auVar117._0_4_ = uVar19;
      auVar117._8_4_ = uVar19;
      auVar117._12_4_ = uVar19;
      local_25f0 = vfmadd231ps_fma(auVar57,auVar117,auVar37);
      local_25c0 = vsubps_avx(local_2570,auVar51);
      local_25e0 = vsubps_avx(local_2580,auVar54);
      auVar56._0_4_ = local_2570._0_4_ + auVar51._0_4_;
      auVar56._4_4_ = local_2570._4_4_ + auVar51._4_4_;
      auVar56._8_4_ = local_2570._8_4_ + auVar51._8_4_;
      auVar56._12_4_ = local_2570._12_4_ + auVar51._12_4_;
      auVar59._0_4_ = auVar54._0_4_ + fVar115;
      auVar59._4_4_ = auVar54._4_4_ + fVar124;
      auVar59._8_4_ = auVar54._8_4_ + fVar88;
      auVar59._12_4_ = auVar54._12_4_ + fVar96;
      fVar99 = local_25e0._0_4_;
      auVar67._0_4_ = auVar56._0_4_ * fVar99;
      fVar91 = local_25e0._4_4_;
      auVar67._4_4_ = auVar56._4_4_ * fVar91;
      fVar93 = local_25e0._8_4_;
      auVar67._8_4_ = auVar56._8_4_ * fVar93;
      fVar95 = local_25e0._12_4_;
      auVar67._12_4_ = auVar56._12_4_ * fVar95;
      auVar37 = vfmsub231ps_fma(auVar67,local_25c0,auVar59);
      local_25d0 = vsubps_avx(local_2760,auVar43);
      fVar125 = local_25d0._0_4_;
      auVar75._0_4_ = fVar125 * auVar59._0_4_;
      fVar128 = local_25d0._4_4_;
      auVar75._4_4_ = fVar128 * auVar59._4_4_;
      fVar130 = local_25d0._8_4_;
      auVar75._8_4_ = fVar130 * auVar59._8_4_;
      fVar132 = local_25d0._12_4_;
      auVar75._12_4_ = fVar132 * auVar59._12_4_;
      auVar60._0_4_ = auVar43._0_4_ + local_2760._0_4_;
      auVar60._4_4_ = auVar43._4_4_ + local_2760._4_4_;
      auVar60._8_4_ = auVar43._8_4_ + local_2760._8_4_;
      auVar60._12_4_ = auVar43._12_4_ + local_2760._12_4_;
      auVar57 = vfmsub231ps_fma(auVar75,local_25e0,auVar60);
      fVar90 = local_25c0._0_4_;
      auVar61._0_4_ = auVar60._0_4_ * fVar90;
      fVar92 = local_25c0._4_4_;
      auVar61._4_4_ = auVar60._4_4_ * fVar92;
      fVar94 = local_25c0._8_4_;
      auVar61._8_4_ = auVar60._8_4_ * fVar94;
      fVar97 = local_25c0._12_4_;
      auVar61._12_4_ = auVar60._12_4_ * fVar97;
      auVar35 = vfmsub231ps_fma(auVar61,local_25d0,auVar56);
      auVar62._0_4_ = fVar106 * auVar35._0_4_;
      auVar62._4_4_ = fVar106 * auVar35._4_4_;
      auVar62._8_4_ = fVar106 * auVar35._8_4_;
      auVar62._12_4_ = fVar106 * auVar35._12_4_;
      auVar57 = vfmadd231ps_fma(auVar62,auVar82,auVar57);
      local_26e0._16_16_ = vfmadd231ps_fma(auVar57,auVar117,auVar37);
      auVar57 = vsubps_avx(auVar43,auVar44);
      auVar68._0_4_ = auVar43._0_4_ + auVar44._0_4_;
      auVar68._4_4_ = auVar43._4_4_ + auVar44._4_4_;
      auVar68._8_4_ = auVar43._8_4_ + auVar44._8_4_;
      auVar68._12_4_ = auVar43._12_4_ + auVar44._12_4_;
      auVar44 = vsubps_avx(auVar51,auVar63);
      auVar37._0_4_ = auVar51._0_4_ + auVar63._0_4_;
      auVar37._4_4_ = auVar51._4_4_ + auVar63._4_4_;
      auVar37._8_4_ = auVar51._8_4_ + auVar63._8_4_;
      auVar37._12_4_ = auVar51._12_4_ + auVar63._12_4_;
      auVar63 = vsubps_avx(auVar54,auVar46);
      auVar45._0_4_ = auVar54._0_4_ + auVar46._0_4_;
      auVar45._4_4_ = auVar54._4_4_ + auVar46._4_4_;
      auVar45._8_4_ = auVar54._8_4_ + auVar46._8_4_;
      auVar45._12_4_ = auVar54._12_4_ + auVar46._12_4_;
      auVar76._0_4_ = auVar37._0_4_ * auVar63._0_4_;
      auVar76._4_4_ = auVar37._4_4_ * auVar63._4_4_;
      auVar76._8_4_ = auVar37._8_4_ * auVar63._8_4_;
      auVar76._12_4_ = auVar37._12_4_ * auVar63._12_4_;
      auVar51 = vfmsub231ps_fma(auVar76,auVar44,auVar45);
      auVar46._0_4_ = auVar45._0_4_ * auVar57._0_4_;
      auVar46._4_4_ = auVar45._4_4_ * auVar57._4_4_;
      auVar46._8_4_ = auVar45._8_4_ * auVar57._8_4_;
      auVar46._12_4_ = auVar45._12_4_ * auVar57._12_4_;
      auVar43 = vfmsub231ps_fma(auVar46,auVar63,auVar68);
      auVar69._0_4_ = auVar44._0_4_ * auVar68._0_4_;
      auVar69._4_4_ = auVar44._4_4_ * auVar68._4_4_;
      auVar69._8_4_ = auVar44._8_4_ * auVar68._8_4_;
      auVar69._12_4_ = auVar44._12_4_ * auVar68._12_4_;
      auVar54 = vfmsub231ps_fma(auVar69,auVar57,auVar37);
      auVar70._0_4_ = fVar106 * auVar54._0_4_;
      auVar70._4_4_ = fVar106 * auVar54._4_4_;
      auVar70._8_4_ = fVar106 * auVar54._8_4_;
      auVar70._12_4_ = fVar106 * auVar54._12_4_;
      auVar43 = vfmadd231ps_fma(auVar70,auVar82,auVar43);
      auVar54 = vfmadd231ps_fma(auVar43,auVar117,auVar51);
      local_26c0._0_4_ = auVar54._0_4_ + local_25f0._0_4_ + local_26e0._16_4_;
      local_26c0._4_4_ = auVar54._4_4_ + local_25f0._4_4_ + local_26e0._20_4_;
      local_26c0._8_4_ = auVar54._8_4_ + local_25f0._8_4_ + local_26e0._24_4_;
      local_26c0._12_4_ = auVar54._12_4_ + local_25f0._12_4_ + local_26e0._28_4_;
      auVar126._8_4_ = 0x7fffffff;
      auVar126._0_8_ = 0x7fffffff7fffffff;
      auVar126._12_4_ = 0x7fffffff;
      auVar43 = vminps_avx(local_25f0,local_26e0._16_16_);
      auVar43 = vminps_avx(auVar43,auVar54);
      local_2600 = vandps_avx(local_26c0,auVar126);
      auVar83._0_4_ = local_2600._0_4_ * 1.1920929e-07;
      auVar83._4_4_ = local_2600._4_4_ * 1.1920929e-07;
      auVar83._8_4_ = local_2600._8_4_ * 1.1920929e-07;
      auVar83._12_4_ = local_2600._12_4_ * 1.1920929e-07;
      uVar29 = CONCAT44(auVar83._4_4_,auVar83._0_4_);
      auVar77._0_8_ = uVar29 ^ 0x8000000080000000;
      auVar77._8_4_ = -auVar83._8_4_;
      auVar77._12_4_ = -auVar83._12_4_;
      auVar43 = vcmpps_avx(auVar43,auVar77,5);
      auVar51 = vmaxps_avx(local_25f0,local_26e0._16_16_);
      auVar51 = vmaxps_avx(auVar51,auVar54);
      auVar51 = vcmpps_avx(auVar51,auVar83,2);
      local_27a0 = vorps_avx(auVar43,auVar51);
      if ((((local_27a0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (local_27a0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_27a0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          local_27a0[0xf] < '\0') {
        auVar47._0_4_ = fVar90 * local_25a0._0_4_;
        auVar47._4_4_ = fVar92 * local_25a0._4_4_;
        auVar47._8_4_ = fVar94 * local_25a0._8_4_;
        auVar47._12_4_ = fVar97 * local_25a0._12_4_;
        auVar71._0_4_ = fVar125 * local_25b0._0_4_;
        auVar71._4_4_ = fVar128 * local_25b0._4_4_;
        auVar71._8_4_ = fVar130 * local_25b0._8_4_;
        auVar71._12_4_ = fVar132 * local_25b0._12_4_;
        auVar54 = vfmsub213ps_fma(local_25b0,local_25e0,auVar47);
        auVar78._0_4_ = auVar44._0_4_ * fVar99;
        auVar78._4_4_ = auVar44._4_4_ * fVar91;
        auVar78._8_4_ = auVar44._8_4_ * fVar93;
        auVar78._12_4_ = auVar44._12_4_ * fVar95;
        auVar84._0_4_ = fVar125 * auVar63._0_4_;
        auVar84._4_4_ = fVar128 * auVar63._4_4_;
        auVar84._8_4_ = fVar130 * auVar63._8_4_;
        auVar84._12_4_ = fVar132 * auVar63._12_4_;
        auVar63 = vfmsub213ps_fma(auVar63,local_25c0,auVar78);
        auVar43 = vandps_avx(auVar126,auVar47);
        auVar51 = vandps_avx(auVar126,auVar78);
        auVar43 = vcmpps_avx(auVar43,auVar51,1);
        local_2660 = vblendvps_avx(auVar63,auVar54,auVar43);
        auVar64._0_4_ = fVar90 * auVar57._0_4_;
        auVar64._4_4_ = fVar92 * auVar57._4_4_;
        auVar64._8_4_ = fVar94 * auVar57._8_4_;
        auVar64._12_4_ = fVar97 * auVar57._12_4_;
        auVar54 = vfmsub213ps_fma(auVar57,local_25e0,auVar84);
        auVar79._0_4_ = local_2590._0_4_ * fVar99;
        auVar79._4_4_ = local_2590._4_4_ * fVar91;
        auVar79._8_4_ = local_2590._8_4_ * fVar93;
        auVar79._12_4_ = local_2590._12_4_ * fVar95;
        auVar63 = vfmsub213ps_fma(local_25a0,local_25d0,auVar79);
        auVar43 = vandps_avx(auVar126,auVar79);
        auVar51 = vandps_avx(auVar84,auVar126);
        auVar43 = vcmpps_avx(auVar43,auVar51,1);
        local_2650 = vblendvps_avx(auVar54,auVar63,auVar43);
        auVar54 = vfmsub213ps_fma(local_2590,local_25c0,auVar71);
        auVar44 = vfmsub213ps_fma(auVar44,local_25d0,auVar64);
        auVar43 = vandps_avx(auVar126,auVar71);
        auVar51 = vandps_avx(auVar126,auVar64);
        auVar43 = vcmpps_avx(auVar43,auVar51,1);
        local_2640[0] = vblendvps_avx(auVar44,auVar54,auVar43);
        auVar65._0_4_ = local_2640[0]._0_4_ * fVar106;
        auVar65._4_4_ = local_2640[0]._4_4_ * fVar106;
        auVar65._8_4_ = local_2640[0]._8_4_ * fVar106;
        auVar65._12_4_ = local_2640[0]._12_4_ * fVar106;
        auVar43 = vfmadd213ps_fma(auVar82,local_2650,auVar65);
        auVar43 = vfmadd213ps_fma(auVar117,local_2660,auVar43);
        auVar66._0_4_ = auVar43._0_4_ + auVar43._0_4_;
        auVar66._4_4_ = auVar43._4_4_ + auVar43._4_4_;
        auVar66._8_4_ = auVar43._8_4_ + auVar43._8_4_;
        auVar66._12_4_ = auVar43._12_4_ + auVar43._12_4_;
        auVar72._0_4_ = local_2640[0]._0_4_ * fVar115;
        auVar72._4_4_ = local_2640[0]._4_4_ * fVar124;
        auVar72._8_4_ = local_2640[0]._8_4_ * fVar88;
        auVar72._12_4_ = local_2640[0]._12_4_ * fVar96;
        auVar43 = vfmadd213ps_fma(local_2570,local_2650,auVar72);
        auVar51 = vfmadd213ps_fma(local_2760,local_2660,auVar43);
        auVar43 = vrcpps_avx(auVar66);
        auVar85._8_4_ = 0x3f800000;
        auVar85._0_8_ = 0x3f8000003f800000;
        auVar85._12_4_ = 0x3f800000;
        auVar54 = vfnmadd213ps_fma(auVar43,auVar66,auVar85);
        auVar43 = vfmadd132ps_fma(auVar54,auVar43,auVar43);
        local_2670._0_4_ = auVar43._0_4_ * (auVar51._0_4_ + auVar51._0_4_);
        local_2670._4_4_ = auVar43._4_4_ * (auVar51._4_4_ + auVar51._4_4_);
        local_2670._8_4_ = auVar43._8_4_ * (auVar51._8_4_ + auVar51._8_4_);
        local_2670._12_4_ = auVar43._12_4_ * (auVar51._12_4_ + auVar51._12_4_);
        auVar42 = ZEXT1664(local_2670);
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar73._4_4_ = uVar19;
        auVar73._0_4_ = uVar19;
        auVar73._8_4_ = uVar19;
        auVar73._12_4_ = uVar19;
        auVar43 = vcmpps_avx(auVar73,local_2670,2);
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar86._4_4_ = uVar19;
        auVar86._0_4_ = uVar19;
        auVar86._8_4_ = uVar19;
        auVar86._12_4_ = uVar19;
        auVar74 = ZEXT1664(auVar86);
        auVar51 = vcmpps_avx(local_2670,auVar86,2);
        auVar43 = vandps_avx(auVar43,auVar51);
        auVar54 = local_27a0 & auVar43;
        if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar54[0xf] < '\0') {
          auVar43 = vandps_avx(auVar43,local_27a0);
          auVar54 = vcmpps_avx(auVar66,_DAT_01f45a50,4);
          auVar44 = auVar54 & auVar43;
          if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar44[0xf] < '\0') {
            local_2770 = vandps_avx(auVar43,auVar54);
            local_26e0._0_16_ = local_25f0;
            local_26b0 = &local_27c9;
            local_26a0 = local_2770;
            auVar43 = vrcpps_avx(local_26c0);
            auVar53._8_4_ = 0x3f800000;
            auVar53._0_8_ = 0x3f8000003f800000;
            auVar53._12_4_ = 0x3f800000;
            auVar54 = vfnmadd213ps_fma(local_26c0,auVar43,auVar53);
            auVar54 = vfmadd132ps_fma(auVar54,auVar43,auVar43);
            auVar48._8_4_ = 0x219392ef;
            auVar48._0_8_ = 0x219392ef219392ef;
            auVar48._12_4_ = 0x219392ef;
            auVar43 = vcmpps_avx(local_2600,auVar48,5);
            auVar43 = vandps_avx(auVar54,auVar43);
            auVar38._0_4_ = local_25f0._0_4_ * auVar43._0_4_;
            auVar38._4_4_ = local_25f0._4_4_ * auVar43._4_4_;
            auVar38._8_4_ = local_25f0._8_4_ * auVar43._8_4_;
            auVar38._12_4_ = local_25f0._12_4_ * auVar43._12_4_;
            local_2690 = vminps_avx(auVar38,auVar53);
            auVar39._0_4_ = auVar43._0_4_ * local_26e0._16_4_;
            auVar39._4_4_ = auVar43._4_4_ * local_26e0._20_4_;
            auVar39._8_4_ = auVar43._8_4_ * local_26e0._24_4_;
            auVar39._12_4_ = auVar43._12_4_ * local_26e0._28_4_;
            local_2680 = vminps_avx(auVar39,auVar53);
            auVar49._8_4_ = 0x7f800000;
            auVar49._0_8_ = 0x7f8000007f800000;
            auVar49._12_4_ = 0x7f800000;
            auVar43 = vblendvps_avx(auVar49,local_2670,local_2770);
            auVar54 = vshufps_avx(auVar43,auVar43,0xb1);
            auVar54 = vminps_avx(auVar54,auVar43);
            auVar44 = vshufpd_avx(auVar54,auVar54,1);
            auVar54 = vminps_avx(auVar44,auVar54);
            auVar43 = vcmpps_avx(auVar43,auVar54,0);
            auVar44 = local_2770 & auVar43;
            auVar54 = vpcmpeqd_avx(auVar54,auVar54);
            if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar44[0xf] < '\0') {
              auVar54 = auVar43;
            }
            auVar43 = vandps_avx(local_2770,auVar54);
            uVar19 = vmovmskps_avx(auVar43);
            lVar25 = 0;
            for (uVar29 = CONCAT44((int)((ulong)&local_27c9 >> 0x20),uVar19); (uVar29 & 1) == 0;
                uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            auVar43 = vpcmpeqd_avx(auVar51,auVar51);
            auVar80 = ZEXT1664(auVar43);
            local_27a8 = pSVar26;
            do {
              uVar18 = *(uint *)((long)&local_2560 + lVar25 * 4);
              pRVar23 = (RayHitK<4> *)(ulong)uVar18;
              pGVar30 = (pSVar26->geometries).items[(long)pRVar23].ptr;
              if ((pGVar30->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2770 + lVar25 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar19 = *(undefined4 *)(local_2690 + lVar25 * 4);
                  uVar3 = *(undefined4 *)(local_2680 + lVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2670 + lVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2660 + lVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2650 + lVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2640[0] + lVar25 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar19;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_26f0 + lVar25 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar18;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar19 = *(undefined4 *)(local_2690 + lVar25 * 4);
                local_2520._4_4_ = uVar19;
                local_2520._0_4_ = uVar19;
                local_2520._8_4_ = uVar19;
                local_2520._12_4_ = uVar19;
                local_2510 = *(undefined4 *)(local_2680 + lVar25 * 4);
                local_24f0._4_4_ = uVar18;
                local_24f0._0_4_ = uVar18;
                local_24f0._8_4_ = uVar18;
                local_24f0._12_4_ = uVar18;
                uVar19 = *(undefined4 *)((long)&local_26f0 + lVar25 * 4);
                local_2500._4_4_ = uVar19;
                local_2500._0_4_ = uVar19;
                local_2500._8_4_ = uVar19;
                local_2500._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(local_2660 + lVar25 * 4);
                local_2550._4_4_ = uVar19;
                local_2550._0_4_ = uVar19;
                local_2550._8_4_ = uVar19;
                local_2550._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(local_2650 + lVar25 * 4);
                local_2540._4_4_ = uVar19;
                local_2540._0_4_ = uVar19;
                local_2540._8_4_ = uVar19;
                local_2540._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(local_2640[0] + lVar25 * 4);
                local_2530._4_4_ = uVar19;
                local_2530._0_4_ = uVar19;
                local_2530._8_4_ = uVar19;
                local_2530._12_4_ = uVar19;
                uStack_250c = local_2510;
                uStack_2508 = local_2510;
                uStack_2504 = local_2510;
                vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                uStack_24dc = context->user->instID[0];
                local_24e0 = uStack_24dc;
                uStack_24d8 = uStack_24dc;
                uStack_24d4 = uStack_24dc;
                uStack_24d0 = context->user->instPrimID[0];
                uStack_24cc = uStack_24d0;
                uStack_24c8 = uStack_24d0;
                uStack_24c4 = uStack_24d0;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2670 + lVar25 * 4);
                local_2750 = *local_2740;
                local_2720 = local_2750;
                local_2718 = pGVar30->userPtr;
                local_2710 = context->user;
                local_2700 = &local_2550;
                local_26f8 = 4;
                pRVar23 = (RayHitK<4> *)pGVar30->intersectionFilterN;
                local_2780 = auVar42._0_16_;
                local_2790 = auVar74._0_16_;
                local_27a0._0_8_ = lVar25;
                local_2708 = ray;
                if (pRVar23 != (RayHitK<4> *)0x0) {
                  local_2760._0_8_ = pGVar30;
                  auVar43 = auVar80._0_16_;
                  pRVar23 = (RayHitK<4> *)(*(code *)pRVar23)(&local_2720);
                  auVar74 = ZEXT1664(local_2790);
                  auVar42 = ZEXT1664(local_2780);
                  auVar43 = vpcmpeqd_avx(auVar43,auVar43);
                  auVar80 = ZEXT1664(auVar43);
                  pSVar26 = local_27a8;
                  lVar25 = local_27a0._0_8_;
                  pGVar30 = (Geometry *)local_2760._0_8_;
                  k = local_27b8;
                  ray = local_27b0;
                  uVar31 = local_27c0;
                }
                auVar43 = auVar80._0_16_;
                if (local_2750 == (undefined1  [16])0x0) {
                  auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar51 = auVar51 ^ auVar43;
                }
                else {
                  pRVar23 = (RayHitK<4> *)context->args->filter;
                  if ((pRVar23 != (RayHitK<4> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar30->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    pRVar23 = (RayHitK<4> *)(*(code *)pRVar23)(&local_2720);
                    auVar74 = ZEXT1664(local_2790);
                    auVar42 = ZEXT1664(local_2780);
                    auVar43 = vpcmpeqd_avx(auVar43,auVar43);
                    auVar80 = ZEXT1664(auVar43);
                    pSVar26 = local_27a8;
                    lVar25 = local_27a0._0_8_;
                    k = local_27b8;
                    ray = local_27b0;
                    uVar31 = local_27c0;
                  }
                  auVar43 = vpcmpeqd_avx(local_2750,_DAT_01f45a50);
                  auVar51 = auVar43 ^ auVar80._0_16_;
                  if (local_2750 != (undefined1  [16])0x0) {
                    auVar43 = auVar43 ^ auVar80._0_16_;
                    auVar54 = vmaskmovps_avx(auVar43,*local_2700);
                    *(undefined1 (*) [16])(local_2708 + 0xc0) = auVar54;
                    auVar54 = vmaskmovps_avx(auVar43,local_2700[1]);
                    *(undefined1 (*) [16])(local_2708 + 0xd0) = auVar54;
                    auVar54 = vmaskmovps_avx(auVar43,local_2700[2]);
                    *(undefined1 (*) [16])(local_2708 + 0xe0) = auVar54;
                    auVar54 = vmaskmovps_avx(auVar43,local_2700[3]);
                    *(undefined1 (*) [16])(local_2708 + 0xf0) = auVar54;
                    auVar54 = vmaskmovps_avx(auVar43,local_2700[4]);
                    *(undefined1 (*) [16])(local_2708 + 0x100) = auVar54;
                    auVar54 = vmaskmovps_avx(auVar43,local_2700[5]);
                    *(undefined1 (*) [16])(local_2708 + 0x110) = auVar54;
                    auVar54 = vmaskmovps_avx(auVar43,local_2700[6]);
                    *(undefined1 (*) [16])(local_2708 + 0x120) = auVar54;
                    auVar54 = vmaskmovps_avx(auVar43,local_2700[7]);
                    *(undefined1 (*) [16])(local_2708 + 0x130) = auVar54;
                    auVar43 = vmaskmovps_avx(auVar43,local_2700[8]);
                    *(undefined1 (*) [16])(local_2708 + 0x140) = auVar43;
                    pRVar23 = local_2708;
                  }
                }
                auVar40._8_8_ = 0x100000001;
                auVar40._0_8_ = 0x100000001;
                if ((auVar40 & auVar51) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar74._0_4_;
                }
                else {
                  auVar74 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2770 + lVar25 * 4) = 0;
                uVar19 = auVar74._0_4_;
                auVar41._4_4_ = uVar19;
                auVar41._0_4_ = uVar19;
                auVar41._8_4_ = uVar19;
                auVar41._12_4_ = uVar19;
                auVar43 = vcmpps_avx(auVar42._0_16_,auVar41,2);
                local_2770 = vandps_avx(auVar43,local_2770);
              }
              if ((((local_2770 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2770 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2770 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2770[0xf]) break;
              auVar50._8_4_ = 0x7f800000;
              auVar50._0_8_ = 0x7f8000007f800000;
              auVar50._12_4_ = 0x7f800000;
              auVar43 = vblendvps_avx(auVar50,auVar42._0_16_,local_2770);
              auVar51 = vshufps_avx(auVar43,auVar43,0xb1);
              auVar51 = vminps_avx(auVar51,auVar43);
              auVar54 = vshufpd_avx(auVar51,auVar51,1);
              auVar51 = vminps_avx(auVar54,auVar51);
              auVar51 = vcmpps_avx(auVar43,auVar51,0);
              auVar54 = local_2770 & auVar51;
              auVar43 = local_2770;
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                auVar43 = vandps_avx(auVar51,local_2770);
              }
              uVar19 = vmovmskps_avx(auVar43);
              lVar25 = 0;
              for (uVar29 = CONCAT44((int)((ulong)pRVar23 >> 0x20),uVar19); (uVar29 & 1) == 0;
                  uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                lVar25 = lVar25 + 1;
              }
            } while( true );
          }
        }
      }
      auVar80 = ZEXT3264(local_23c0);
      auVar81 = ZEXT3264(local_23e0);
      auVar87 = ZEXT3264(local_2400);
      auVar74 = ZEXT3264(local_2620);
      uVar29 = local_27c8;
      fVar88 = local_2420;
      fVar90 = fStack_241c;
      fVar91 = fStack_2418;
      fVar92 = fStack_2414;
      fVar93 = fStack_2410;
      fVar94 = fStack_240c;
      fVar95 = fStack_2408;
      fVar96 = local_2440;
      fVar97 = fStack_243c;
      fVar125 = fStack_2438;
      fVar128 = fStack_2434;
      fVar130 = fStack_2430;
      fVar132 = fStack_242c;
      fVar98 = fStack_2428;
      fVar99 = local_2460;
      fVar100 = fStack_245c;
      fVar101 = fStack_2458;
      fVar102 = fStack_2454;
      fVar103 = fStack_2450;
      fVar104 = fStack_244c;
      fVar105 = fStack_2448;
      fVar106 = local_2480;
      fVar109 = fStack_247c;
      fVar110 = fStack_2478;
      fVar111 = fStack_2474;
      fVar112 = fStack_2470;
      fVar113 = fStack_246c;
      fVar114 = fStack_2468;
      fVar115 = local_24a0;
      fVar118 = fStack_249c;
      fVar119 = fStack_2498;
      fVar120 = fStack_2494;
      fVar121 = fStack_2490;
      fVar122 = fStack_248c;
      fVar123 = fStack_2488;
      fVar124 = local_24c0;
      fVar127 = fStack_24bc;
      fVar129 = fStack_24b8;
      fVar131 = fStack_24b4;
      fVar133 = fStack_24b0;
      fVar134 = fStack_24ac;
      fVar135 = fStack_24a8;
    }
    uVar19 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar42 = ZEXT3264(CONCAT428(uVar19,CONCAT424(uVar19,CONCAT420(uVar19,CONCAT416(uVar19,CONCAT412
                                                  (uVar19,CONCAT48(uVar19,CONCAT44(uVar19,uVar19))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }